

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Matches * __thiscall
Catch::TestSpec::matchesByFilter
          (Matches *__return_storage_ptr__,TestSpec *this,
          vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases,IConfig *config)

{
  pointer pFVar1;
  pointer pTVar2;
  bool bVar3;
  int iVar4;
  FilterMatch *this_00;
  pointer this_01;
  TestCase *test;
  pointer testCase;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range2;
  pointer local_90;
  vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_> currentMatches;
  FilterMatch local_68;
  
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  vector(__return_storage_ptr__,
         ((long)(this->m_filters).
                super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->m_filters).
               super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&local_68);
  this_01 = (this->m_filters).
            super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->m_filters).
           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = (__return_storage_ptr__->
            super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
            )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (this_01 == pFVar1) {
      return __return_storage_ptr__;
    }
    currentMatches.
    super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    currentMatches.
    super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    currentMatches.
    super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pTVar2 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (testCase = (testCases->
                    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                    super__Vector_impl_data._M_start; testCase != pTVar2; testCase = testCase + 1) {
      if (((testCase->super_TestCaseInfo).properties & Throws) == None) {
LAB_00181469:
        bVar3 = Filter::matches(this_01,&testCase->super_TestCaseInfo);
        if (bVar3) {
          local_90 = testCase;
          std::vector<Catch::TestCase_const*,std::allocator<Catch::TestCase_const*>>::
          emplace_back<Catch::TestCase_const*>
                    ((vector<Catch::TestCase_const*,std::allocator<Catch::TestCase_const*>> *)
                     &currentMatches,&local_90);
        }
      }
      else {
        iVar4 = (*(config->super_NonCopyable)._vptr_NonCopyable[2])(config);
        if ((char)iVar4 != '\0') goto LAB_00181469;
      }
    }
    Filter::name_abi_cxx11_(&local_68.name,this_01);
    clara::std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>::vector
              (&local_68.tests,&currentMatches);
    clara::std::_Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>::
    ~_Vector_base((_Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_> *
                  )&currentMatches);
    FilterMatch::operator=(this_00,&local_68);
    FilterMatch::~FilterMatch(&local_68);
    this_01 = this_01 + 1;
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

TestSpec::Matches TestSpec::matchesByFilter( std::vector<TestCase> const& testCases, IConfig const& config ) const
    {
        Matches matches( m_filters.size() );
        std::transform( m_filters.begin(), m_filters.end(), matches.begin(), [&]( Filter const& filter ){
            std::vector<TestCase const*> currentMatches;
            for( auto const& test : testCases )
                if( isThrowSafe( test, config ) && filter.matches( test ) )
                    currentMatches.emplace_back( &test );
            return FilterMatch{ filter.name(), currentMatches };
        } );
        return matches;
    }